

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.hpp
# Opt level: O0

void __thiscall tfs::TMatrix<double>::randomize(TMatrix<double> *this,DNN_NUMERIC scale)

{
  double *pdVar1;
  bool bVar2;
  TMatrix<double> *in_RDI;
  double in_XMM0_Qa;
  DNN_NUMERIC DVar3;
  double *end;
  double *ptr;
  DNN_NUMERIC max;
  double *local_20;
  double local_10;
  
  bVar2 = isEmpty(in_RDI);
  if (bVar2) {
    report_problem("Error",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/../src/Matrix.hpp"
                   ,"randomize",0x5e,"empty matrix");
  }
  else {
    local_10 = in_XMM0_Qa;
    if (in_XMM0_Qa < 1.0) {
      local_10 = 1.0;
    }
    sqrt(1.0 / local_10);
    pdVar1 = in_RDI->m_end;
    local_20 = in_RDI->m_data;
    while (local_20 < pdVar1) {
      DVar3 = randn(5.74089952563799e-318);
      *local_20 = DVar3;
      local_20 = local_20 + 1;
    }
  }
  return;
}

Assistant:

inline void randomize( DNN_NUMERIC scale ) {             // Fill matrix with small positive values
            // Weight normalization is done to equalize the output variance of every neuron,
            // otherwise neurons with a lot of incoming connections will have outputs with a larger variance
            if( isEmpty()) {
                log_error( "empty matrix" );
                return;
            }
            if( scale < 1.0 ) {
                scale = 1.0;
            }
            const DNN_NUMERIC max = sqrt( 1.0 / scale );
                  T *         ptr = m_data;
            const T * const   end = m_end;
            while( ptr < end ) {
                *ptr++ = (T) randn( max );
            }
        }